

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMdisk.cpp
# Opt level: O3

bool ParseCommandLine(int argc_,char **argv_)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  PreferredData PVar3;
  int iVar4;
  int iVar5;
  exception *peVar6;
  char *pcVar7;
  undefined1 *puVar8;
  long lVar9;
  char **ppcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  string str;
  string local_d0;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  opterr = 1;
switchD_0016690e_caseD_45:
  while( true ) {
    paVar11 = &local_d0.field_2;
    iVar4 = getopt_long(argc_,argv_,short_options,long_options,(int *)0x0);
    pcVar7 = optarg;
    iVar5 = optind;
    sVar1 = opt.label._M_string_length;
    if (0x3e < iVar4) break;
    if (iVar4 < 0x31) {
      if (iVar4 == 0x30) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
        opt.head0 = util::str_value<int>(&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11)
        {
          operator_delete((undefined1 *)
                          CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                          local_d0.field_2._M_allocated_capacity + 1);
        }
        if (1 < opt.head0) {
          peVar6 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[22],char*&,char_const(&)[19]>
                    (peVar6,(char (*) [22])"invalid head0 value \'",&optarg,
                     (char (*) [19])"\', expected 0 or 1");
          goto LAB_00167719;
        }
      }
      else if (iVar4 == -1) {
        if (optind < argc_) {
          pcVar7 = argv_[optind];
          ppcVar10 = aszCommands;
          lVar9 = 0;
          goto LAB_00167643;
        }
        if (opt.verbose == 0) goto LAB_001679d1;
        goto switchD_001669b0_caseD_102;
      }
    }
    else if (iVar4 == 0x31) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
      opt.head1 = util::str_value<int>(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
        operator_delete((undefined1 *)
                        CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                        local_d0.field_2._M_allocated_capacity + 1);
      }
      if (1 < opt.head1) {
        peVar6 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[22],char*&,char_const(&)[19]>
                  (peVar6,(char (*) [22])"invalid head1 value \'",&optarg,
                   (char (*) [19])"\', expected 0 or 1");
        goto LAB_00167719;
      }
    }
    else if (iVar4 == 0x3a) goto LAB_00167610;
  }
  switch(iVar4) {
  case 0x44:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.datacopy = util::str_value<int>(&local_d0);
    break;
  case 0x45:
  case 0x47:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x6a:
  case 0x6c:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x75:
  case 0x77:
  case 0x79:
    goto switchD_0016690e_caseD_45;
  case 0x46:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.fill = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (0xff < opt.fill) {
      peVar6 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[21],char*&,char_const(&)[18]>
                (peVar6,(char (*) [21])"invalid fill value \'",&optarg,
                 (char (*) [18])"\', expected 0-255");
      goto LAB_00167719;
    }
    goto switchD_0016690e_caseD_45;
  case 0x48:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.hardsectors = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (opt.hardsectors < 2) {
      peVar6 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28],char*&,char_const(&)[2]>
                (peVar6,(char (*) [28])"invalid hard-sector count \'",&optarg,(char (*) [2])0x1afe8f
                );
      goto LAB_00167719;
    }
    goto switchD_0016690e_caseD_45;
  case 0x4c:
    strlen(optarg);
    std::__cxx11::string::_M_replace(0x1de888,0,(char *)sVar1,(ulong)pcVar7);
    goto switchD_0016690e_caseD_45;
  case 0x52:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.rescans = util::str_value<int>(&local_d0);
    break;
  case 0x62:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.base = util::str_value<int>(&local_d0);
    break;
  case 99:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    util::str_range(&local_d0,(int *)&opt,&opt.range.cyl_end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    iVar5 = Range::cyls(&opt.range);
    if (iVar5 == 0) {
      opt.range.cyl_end = 1;
    }
    goto switchD_0016690e_caseD_45;
  case 100:
    opt.step = 2;
    goto switchD_0016690e_caseD_45;
  case 0x65:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,optarg,(allocator<char> *)&local_d0);
    opt.encoding = encoding_from_string(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (opt.encoding == Unknown) {
      peVar6 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[19],char*&,char_const(&)[2]>
                (peVar6,(char (*) [19])"invalid encoding \'",&optarg,(char (*) [2])0x1afe8f);
      goto LAB_00167719;
    }
    goto switchD_0016690e_caseD_45;
  case 0x66:
    opt.force = opt.force + 1;
    goto switchD_0016690e_caseD_45;
  case 0x67:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.gap3 = util::str_value<int>(&local_d0);
    break;
  case 0x68:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    iVar5 = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (2 < iVar5) {
      peVar6 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28],char*&,char_const(&)[15],int_const&>
                (peVar6,(char (*) [28])"invalid head count/select \'",&optarg,
                 (char (*) [15])"\', expected 0-",&MAX_DISK_HEADS);
      goto LAB_00167719;
    }
    opt.range.head_begin = (int)(iVar5 == 1);
    opt.range.head_end = 2 - (uint)(iVar5 == 0);
    goto switchD_0016690e_caseD_45;
  case 0x69:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.interleave = util::str_value<int>(&local_d0);
    break;
  case 0x6b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.skew = util::str_value<int>(&local_d0);
    break;
  case 0x6d:
    opt.minimal = 1;
    goto switchD_0016690e_caseD_45;
  case 0x6e:
    opt.noformat = 1;
    goto switchD_0016690e_caseD_45;
  case 0x72:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.retries = util::str_value<int>(&local_d0);
    break;
  case 0x73:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.sectors = util::str_value<long>(&local_d0);
    break;
  case 0x74:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,optarg,(allocator<char> *)&local_d0);
    opt.datarate = datarate_from_string(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (opt.datarate == Unknown) {
      peVar6 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[20],char*&,char_const(&)[2]>
                (peVar6,(char (*) [20])"invalid data rate \'",&optarg,(char (*) [2])0x1afe8f);
      goto LAB_00167719;
    }
    goto switchD_0016690e_caseD_45;
  case 0x76:
    opt.verbose = opt.verbose + 1;
    goto switchD_0016690e_caseD_45;
  case 0x78:
    opt.hex = 1;
    goto switchD_0016690e_caseD_45;
  case 0x7a:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.size = util::str_value<int>(&local_d0);
    break;
  default:
    goto code_r0x001669a2;
  }
  goto LAB_001671d1;
switchD_001669b0_caseD_102:
  Version();
  ReportTypes();
  ReportBuildOptions();
  return false;
  while( true ) {
    lVar9 = lVar9 + 1;
    ppcVar10 = ppcVar10 + 1;
    if (lVar9 == 0xc) break;
LAB_00167643:
    iVar4 = strcasecmp(pcVar7,*ppcVar10);
    if (iVar4 == 0) {
      if (opt.command != 0) {
LAB_001679d1:
        Usage();
LAB_001679d6:
        peVar6 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[20],char*&,char_const(&)[33]>
                  (peVar6,(char (*) [20])"invalid data type \'",&optarg,
                   (char (*) [33])"\', expected track/bitstream/flux");
        __cxa_throw(peVar6,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      opt.command = (int)lVar9;
      optind = iVar5 + 1;
      break;
    }
  }
  if (opt.absoffsets != 0) {
    opt.offsets = 1;
  }
  return true;
code_r0x001669a2:
  switch(iVar4) {
  case 0x100:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.rpm = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((opt.rpm == 300) || (opt.rpm == 0x168)) goto switchD_0016690e_caseD_45;
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[14],char*&,char_const(&)[23]>
              (peVar6,(char (*) [14])"invalid rpm \'",&optarg,
               (char (*) [23])"\', expected 300 or 360");
    break;
  case 0x101:
    if (optarg == (char *)0x0) {
      pcVar7 = "samdisk.log";
    }
    std::ofstream::open((char *)&util::log,(_Ios_Openmode)pcVar7);
    if (((&DAT_001df0d0)[*(long *)(util::log + -0x18)] & 1) == 0) {
      DAT_001df2b8 = &util::log;
      goto switchD_0016690e_caseD_45;
    }
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[36]>
              (peVar6,(char (*) [36])"failed to open log file for writing");
    break;
  case 0x102:
    goto switchD_001669b0_caseD_102;
  case 0x103:
  case 0x104:
    goto switchD_0016690e_caseD_45;
  case 0x105:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.gapmask = util::str_value<int>(&local_d0);
    goto LAB_001671d1;
  case 0x106:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.maxcopies = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (opt.maxcopies != 0) goto switchD_0016690e_caseD_45;
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[26],char*&,char_const(&)[17]>
              (peVar6,(char (*) [26])"invalid data copy count \'",&optarg,
               (char (*) [17])"\', expected >= 1");
    break;
  case 0x107:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.maxsplice = util::str_value<int>(&local_d0);
    goto LAB_001671d1;
  case 0x108:
    if (optarg == (char *)0x0) {
      opt.check8k = 1;
      goto switchD_0016690e_caseD_45;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.check8k = util::str_value<int>(&local_d0);
    goto LAB_001671d1;
  case 0x109:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    util::str_range(&local_d0,&opt.bytes_begin,&opt.bytes_end);
    goto LAB_001671d1;
  case 0x10a:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.hdf = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (0xfffffffd < opt.hdf - 0xcU) goto switchD_0016690e_caseD_45;
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[22],char*&,char_const(&)[21]>
              (peVar6,(char (*) [22])"invalid HDF version \'",&optarg,
               (char (*) [21])"\', expected 10 or 11");
    break;
  case 0x10b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,optarg,(allocator<char> *)local_90);
    util::lowercase(&local_d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"cylinders","");
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
    _Var2._M_p = local_b0._M_dataplus._M_p;
    if (local_d0._M_string_length == local_b0._M_string_length) {
      if (local_d0._M_string_length == 0) {
        bVar12 = true;
      }
      else {
        iVar5 = bcmp((void *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,
                                      local_d0._M_dataplus._M_p._0_4_),local_b0._M_dataplus._M_p,
                     local_d0._M_string_length);
        bVar12 = iVar5 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != &local_b0.field_2) {
      operator_delete(_Var2._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    iVar5 = 1;
    PVar3 = opt.prefer;
    if (!bVar12) {
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"heads","");
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
      _Var2._M_p = local_b0._M_dataplus._M_p;
      if (local_d0._M_string_length == local_b0._M_string_length) {
        if (local_d0._M_string_length == 0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp((void *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,
                                        local_d0._M_dataplus._M_p._0_4_),local_b0._M_dataplus._M_p,
                       local_d0._M_string_length);
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_b0.field_2) {
        operator_delete(_Var2._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      iVar5 = 0;
      PVar3 = opt.prefer;
      if (!bVar12) {
        peVar6 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[21],char*&,char_const(&)[35]>
                  (peVar6,(char (*) [21])"invalid order type \'",&optarg,
                   (char (*) [35])"\', expected \'cylinders\' or \'heads\'");
        __cxa_throw(peVar6,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    goto LAB_00167601;
  case 0x10c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.scale = util::str_value<int>(&local_d0);
LAB_001671d1:
    puVar8 = (undefined1 *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_)
    ;
LAB_001671d6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8 != &local_d0.field_2) {
      operator_delete(puVar8,local_d0.field_2._M_allocated_capacity + 1);
    }
    goto switchD_0016690e_caseD_45;
  case 0x10d:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.plladjust = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (0xffffffcd < opt.plladjust - 0x33U) goto switchD_0016690e_caseD_45;
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    local_d0._M_dataplus._M_p._0_4_ = 0x32;
    util::exception::exception<char_const(&)[25],char*&,char_const(&)[15],int>
              (peVar6,(char (*) [25])"invalid pll adjustment \'",&optarg,
               (char (*) [15])"\', expected 1-",(int *)&local_d0);
    break;
  case 0x10e:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.pllphase = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (0xffffffa5 < opt.pllphase - 0x5bU) goto switchD_0016690e_caseD_45;
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    local_d0._M_dataplus._M_p._0_4_ = 0x5a;
    util::exception::exception<char_const(&)[20],char*&,char_const(&)[15],int>
              (peVar6,(char (*) [20])"invalid pll phase \'",&optarg,(char (*) [15])"\', expected 1-"
               ,(int *)&local_d0);
    break;
  case 0x10f:
    opt.encoding = Ace;
    goto switchD_0016690e_caseD_45;
  case 0x110:
    opt.encoding = MX;
    goto switchD_0016690e_caseD_45;
  case 0x111:
    opt.encoding = Agat;
    goto switchD_0016690e_caseD_45;
  case 0x112:
    opt.encoding = MFM;
    goto switchD_0016690e_caseD_45;
  case 0x113:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.steprate = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (opt.steprate < 0x10) goto switchD_0016690e_caseD_45;
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[20],char*&,char_const(&)[17]>
              (peVar6,(char (*) [20])"invalid step rate \'",&optarg,
               (char (*) [17])"\', expected 0-15");
    break;
  case 0x114:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,optarg,(allocator<char> *)local_90);
    util::lowercase(&local_d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"track","");
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
    _Var2._M_p = local_b0._M_dataplus._M_p;
    if (local_d0._M_string_length == local_b0._M_string_length) {
      if (local_d0._M_string_length == 0) {
        bVar12 = true;
      }
      else {
        iVar5 = bcmp((void *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,
                                      local_d0._M_dataplus._M_p._0_4_),local_b0._M_dataplus._M_p,
                     local_d0._M_string_length);
        bVar12 = iVar5 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != &local_b0.field_2) {
      operator_delete(_Var2._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    iVar5 = opt.cylsfirst;
    PVar3 = Track;
    if (!bVar12) {
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"bitstream","");
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
      _Var2._M_p = local_b0._M_dataplus._M_p;
      if (local_d0._M_string_length == local_b0._M_string_length) {
        if (local_d0._M_string_length == 0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp((void *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,
                                        local_d0._M_dataplus._M_p._0_4_),local_b0._M_dataplus._M_p,
                       local_d0._M_string_length);
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_b0.field_2) {
        operator_delete(_Var2._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      iVar5 = opt.cylsfirst;
      PVar3 = Bitstream;
      if (!bVar12) {
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"flux","");
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
        _Var2._M_p = local_b0._M_dataplus._M_p;
        if (local_d0._M_string_length == local_b0._M_string_length) {
          if (local_d0._M_string_length == 0) {
            bVar12 = true;
          }
          else {
            iVar5 = bcmp((void *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,
                                          local_d0._M_dataplus._M_p._0_4_),local_b0._M_dataplus._M_p
                         ,local_d0._M_string_length);
            bVar12 = iVar5 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_b0.field_2) {
          operator_delete(_Var2._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        iVar5 = opt.cylsfirst;
        PVar3 = Flux;
        if (!bVar12) goto LAB_001679d6;
      }
    }
LAB_00167601:
    opt.prefer = PVar3;
    opt.cylsfirst = iVar5;
    puVar8 = (undefined1 *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_)
    ;
    goto LAB_001671d6;
  case 0x115:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,optarg,(allocator<char> *)&local_b0);
    opt.debug = util::str_value<int>(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) != paVar11) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                      local_d0.field_2._M_allocated_capacity + 1);
    }
    if (-1 < opt.debug) goto switchD_0016690e_caseD_45;
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[35]>
              (peVar6,(char (*) [35])"invalid debug level, expected >= 0");
    break;
  default:
    if (iVar4 == 0x3f) {
LAB_00167610:
      local_d0._M_dataplus._M_p._0_4_ = CONCAT31(local_d0._M_dataplus._M_p._1_3_,10);
      util::operator<<((LogHelper *)&util::cout,(char *)&local_d0);
      return false;
    }
    goto switchD_0016690e_caseD_45;
  }
LAB_00167719:
  __cxa_throw(peVar6,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ParseCommandLine(int argc_, char* argv_[])
{
    int arg;
    opterr = 1;

    while ((arg = getopt_long(argc_, argv_, short_options, long_options, nullptr)) != -1)
    {
        switch (arg)
        {
        case 'c':
            util::str_range(optarg, opt.range.cyl_begin, opt.range.cyl_end);

            // -c0 is shorthand for -c0-0
            if (opt.range.cyls() == 0)
                opt.range.cyl_end = 1;
            break;

        case 'h':
        {
            auto heads = util::str_value<int>(optarg);
            if (heads > MAX_DISK_HEADS)
                throw util::exception("invalid head count/select '", optarg, "', expected 0-", MAX_DISK_HEADS);

            opt.range.head_begin = (heads == 1) ? 1 : 0;
            opt.range.head_end = (heads == 0) ? 1 : 2;
            break;
        }

        case 's':
            opt.sectors = util::str_value<long>(optarg);
            break;

        case 'H':
            opt.hardsectors = util::str_value<int>(optarg);
            if (opt.hardsectors <= 1)
                throw util::exception("invalid hard-sector count '", optarg, "'");
            break;

        case 'r':
            opt.retries = util::str_value<int>(optarg);
            break;

        case 'R':
            opt.rescans = util::str_value<int>(optarg);
            break;

        case 'n':   opt.noformat = 1; break;
        case 'm':   opt.minimal = 1; break;

        case 'b':   opt.base = util::str_value<int>(optarg); break;
        case 'z':   opt.size = util::str_value<int>(optarg); break;
        case 'g':   opt.gap3 = util::str_value<int>(optarg); break;
        case 'i':   opt.interleave = util::str_value<int>(optarg); break;
        case 'k':   opt.skew = util::str_value<int>(optarg); break;
        case 'D':   opt.datacopy = util::str_value<int>(optarg); break;

        case 'F':
            opt.fill = util::str_value<int>(optarg);
            if (opt.fill > 255)
                throw util::exception("invalid fill value '", optarg, "', expected 0-255");
            break;
        case '0':
            opt.head0 = util::str_value<int>(optarg);
            if (opt.head0 > 1)
                throw util::exception("invalid head0 value '", optarg, "', expected 0 or 1");
            break;
        case '1':
            opt.head1 = util::str_value<int>(optarg);
            if (opt.head1 > 1)
                throw util::exception("invalid head1 value '", optarg, "', expected 0 or 1");
            break;

        case 't':
            opt.datarate = datarate_from_string(optarg);
            if (opt.datarate == DataRate::Unknown)
                throw util::exception("invalid data rate '", optarg, "'");
            break;

        case 'e':
            opt.encoding = encoding_from_string(optarg);
            if (opt.encoding == Encoding::Unknown)
                throw util::exception("invalid encoding '", optarg, "'");
            break;

        case 'd':   opt.step = 2; break;
        case 'f':   ++opt.force; break;
        case 'v':   ++opt.verbose; break;
        case 'x':   opt.hex = 1; break;

        case 'L':   opt.label = optarg; break;

        case OPT_LOG:
            util::log.open(optarg ? optarg : "samdisk.log");
            if (util::log.bad())
                throw util::exception("failed to open log file for writing");
            util::cout.file = &util::log;
            break;

        case OPT_ORDER:
        {
            auto str = util::lowercase(optarg);
            if (str == std::string("cylinders").substr(0, str.length()))
                opt.cylsfirst = 1;
            else if (str == std::string("heads").substr(0, str.length()))
                opt.cylsfirst = 0;
            else
                throw util::exception("invalid order type '", optarg, "', expected 'cylinders' or 'heads'");
            break;
        }

        case OPT_PREFER:
        {
            auto str = util::lowercase(optarg);
            if (str == std::string("track").substr(0, str.length()))
                opt.prefer = PreferredData::Track;
            else if (str == std::string("bitstream").substr(0, str.length()))
                opt.prefer = PreferredData::Bitstream;
            else if (str == std::string("flux").substr(0, str.length()))
                opt.prefer = PreferredData::Flux;
            else
                throw util::exception("invalid data type '", optarg, "', expected track/bitstream/flux");
            break;
        }

        case OPT_ACE:   opt.encoding = Encoding::Ace;   break;
        case OPT_MX:    opt.encoding = Encoding::MX;    break;
        case OPT_AGAT:  opt.encoding = Encoding::Agat;  break;
        case OPT_NOFM:  opt.encoding = Encoding::MFM;   break;

        case OPT_GAPMASK:
            opt.gapmask = util::str_value<int>(optarg);
            break;
        case OPT_MAXCOPIES:
            opt.maxcopies = util::str_value<int>(optarg);
            if (!opt.maxcopies)
                throw util::exception("invalid data copy count '", optarg, "', expected >= 1");
            break;
        case OPT_MAXSPLICE:
            opt.maxsplice = util::str_value<int>(optarg);
            break;
        case OPT_CHECK8K:
            opt.check8k = !optarg ? 1 : util::str_value<int>(optarg);
            break;
        case OPT_RPM:
            opt.rpm = util::str_value<int>(optarg);
            if (opt.rpm != 300 && opt.rpm != 360)
                throw util::exception("invalid rpm '", optarg, "', expected 300 or 360");
            break;
        case OPT_HDF:
            opt.hdf = util::str_value<int>(optarg);
            if (opt.hdf != 10 && opt.hdf != 11)
                throw util::exception("invalid HDF version '", optarg, "', expected 10 or 11");
            break;
        case OPT_SCALE:
            opt.scale = util::str_value<int>(optarg);
            break;
        case OPT_PLLADJUST:
            opt.plladjust = util::str_value<int>(optarg);
            if (opt.plladjust <= 0 || opt.plladjust > MAX_PLL_ADJUST)
                throw util::exception("invalid pll adjustment '", optarg, "', expected 1-", MAX_PLL_ADJUST);
            break;
        case OPT_PLLPHASE:
            opt.pllphase = util::str_value<int>(optarg);
            if (opt.pllphase <= 0 || opt.pllphase > MAX_PLL_PHASE)
                throw util::exception("invalid pll phase '", optarg, "', expected 1-", MAX_PLL_PHASE);
            break;
        case OPT_STEPRATE:
            opt.steprate = util::str_value<int>(optarg);
            if (opt.steprate > 15)
                throw util::exception("invalid step rate '", optarg, "', expected 0-15");
            break;

        case OPT_BYTES:
            util::str_range(optarg, opt.bytes_begin, opt.bytes_end);
            break;

        case OPT_DEBUG:
            opt.debug = util::str_value<int>(optarg);
            if (opt.debug < 0)
                throw util::exception("invalid debug level, expected >= 0");
            break;

        case OPT_VERSION:
            LongVersion();
            return false;

        case ':':
        case '?':   // error
            util::cout << '\n';
            return false;

            // long option return
        case 0:
            break;
#ifdef _DEBUG
        default:
            return false;
#endif
        }
    }

    // Fail if there are no non-option arguments
    if (optind >= argc_)
    {
        if (!opt.verbose)
            Usage();

        // Allow -v to show the --version details
        LongVersion();
        return false;
    }

    // The command is the first argument
    char* pszCommand = argv_[optind];

    // Match against known commands
    for (int i = 0; i < cmdEnd; ++i)
    {
        if (!strcasecmp(pszCommand, aszCommands[i]))
        {
            // Fail if a command has already been set
            if (opt.command)
                Usage();

            // Set the command and advance to the next argument position
            opt.command = i;
            ++optind;
            break;
        }
    }

    if (opt.absoffsets) opt.offsets = 1;

    return true;
}